

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int __thiscall QDockAreaLayoutInfo::separatorMove(QDockAreaLayoutInfo *this,int index,int delta)

{
  QDockAreaLayoutItem *pQVar1;
  Orientation OVar2;
  QDockAreaLayoutItem *pQVar3;
  Representation RVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pointer pQVar8;
  QSize QVar9;
  pointer pQVar10;
  QSize QVar11;
  QSize QVar12;
  undefined1 *puVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  QRect QVar16;
  Representation local_70;
  QList<QLayoutStruct> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList(&local_58,(this->item_list).d.size);
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar14 = 0x1c;
    lVar15 = 0;
    puVar13 = (undefined1 *)0x0;
    do {
      pQVar3 = (this->item_list).d.ptr;
      pQVar1 = (QDockAreaLayoutItem *)((long)&pQVar3->widgetItem + lVar15);
      pQVar8 = QList<QLayoutStruct>::data(&local_58);
      bVar5 = QDockAreaLayoutItem::skip(pQVar1);
      if (bVar5) {
        *(undefined1 *)((long)pQVar8 + lVar14 + -7) = 1;
      }
      else {
        OVar2 = this->o;
        QVar11 = QDockAreaLayoutItem::minimumSize(pQVar1);
        QVar12 = QDockAreaLayoutItem::maximumSize(pQVar1);
        bVar5 = OVar2 == Vertical;
        QVar9 = (QSize)((ulong)QVar11 >> 0x20);
        if (bVar5) {
          QVar9 = QVar11;
        }
        QVar11 = (QSize)((ulong)QVar12 >> 0x20);
        if (bVar5) {
          QVar11 = QVar12;
        }
        iVar6 = 0;
        if (QVar9.wd.m_i.m_i != QVar11.wd.m_i.m_i) {
          iVar6 = *this->sep;
        }
        *(undefined1 *)((long)pQVar8 + lVar14 + -7) = 0;
        *(undefined4 *)((long)pQVar8 + lVar14 + -4) = *(undefined4 *)((long)&pQVar3->pos + lVar15);
        *(int *)((long)&pQVar8->stretch + lVar14) = *(int *)((long)&pQVar3->size + lVar15) + iVar6;
        OVar2 = this->o;
        QVar9 = QDockAreaLayoutItem::minimumSize(pQVar1);
        RVar4 = QVar9.ht.m_i;
        if (OVar2 == Horizontal) {
          RVar4 = QVar9.wd.m_i;
        }
        *(int *)((long)pQVar8 + lVar14 + -0x10) = RVar4.m_i + iVar6;
        OVar2 = this->o;
        QVar9 = QDockAreaLayoutItem::maximumSize(pQVar1);
        RVar4 = QVar9.ht.m_i;
        if (OVar2 == Horizontal) {
          RVar4 = QVar9.wd.m_i;
        }
        *(int *)((long)pQVar8 + lVar14 + -0x14) = RVar4.m_i + iVar6;
      }
      puVar13 = puVar13 + 1;
      lVar14 = lVar14 + 0x20;
      lVar15 = lVar15 + 0x28;
    } while (puVar13 < (ulong)local_58.d.size);
  }
  iVar6 = separatorMoveHelper(&local_58,index,delta,0);
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar14 = 0x1c;
    lVar15 = 0;
    puVar13 = (undefined1 *)0x0;
    do {
      pQVar10 = QList<QDockAreaLayoutItem>::data(&this->item_list);
      pQVar1 = (QDockAreaLayoutItem *)((long)&pQVar10->widgetItem + lVar15);
      bVar5 = QDockAreaLayoutItem::skip(pQVar1);
      if (!bVar5) {
        pQVar8 = QList<QLayoutStruct>::data(&local_58);
        OVar2 = this->o;
        QVar11 = QDockAreaLayoutItem::minimumSize(pQVar1);
        QVar12 = QDockAreaLayoutItem::maximumSize(pQVar1);
        local_70 = QVar11.wd.m_i;
        QVar9 = (QSize)((ulong)QVar12 >> 0x20);
        RVar4.m_i = QVar11.ht.m_i.m_i;
        if (OVar2 == Vertical) {
          QVar9 = QVar12;
          RVar4.m_i = local_70.m_i;
        }
        iVar7 = 0;
        if (RVar4.m_i != QVar9.wd.m_i.m_i) {
          iVar7 = *this->sep;
        }
        *(int *)((long)&pQVar10->size + lVar15) = *(int *)((long)&pQVar8->stretch + lVar14) - iVar7;
        *(undefined4 *)((long)&pQVar10->pos + lVar15) = *(undefined4 *)((long)pQVar8 + lVar14 + -4);
        if (*(long *)((long)&pQVar10->subinfo + lVar15) != 0) {
          QVar16 = itemRect(this,(int)puVar13,false);
          *(QRect *)(*(long *)((long)&pQVar10->subinfo + lVar15) + 0x28) = QVar16;
          fitItems(*(QDockAreaLayoutInfo **)((long)&pQVar10->subinfo + lVar15));
        }
      }
      puVar13 = puVar13 + 1;
      lVar14 = lVar14 + 0x20;
      lVar15 = lVar15 + 0x28;
    } while (puVar13 < (ulong)local_58.d.size);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x20,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int QDockAreaLayoutInfo::separatorMove(int index, int delta)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!tabbed);
#endif

    QList<QLayoutStruct> list(item_list.size());
    for (int i = 0; i < list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        QLayoutStruct &ls = list[i];
        Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
        if (item.skip()) {
            ls.empty = true;
        } else {
            const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
            ls.empty = false;
            ls.pos = item.pos;
            ls.size = item.size + separatorSpace;
            ls.minimumSize = pick(o, item.minimumSize()) + separatorSpace;
            ls.maximumSize = pick(o, item.maximumSize()) + separatorSpace;

        }
    }

    //the separator space has been added to the size, so we pass 0 as a parameter
    delta = separatorMoveHelper(list, index, delta, 0 /*separator*/);

    for (int i = 0; i < list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];
        if (item.skip())
            continue;
        QLayoutStruct &ls = list[i];
        const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
        item.size = ls.size - separatorSpace;
        item.pos = ls.pos;
        if (item.subinfo != nullptr) {
            item.subinfo->rect = itemRect(i);
            item.subinfo->fitItems();
        }
    }

    return delta;
}